

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall cmMakefileTargetGenerator::WriteTargetDependRules(cmMakefileTargetGenerator *this)

{
  string *localPath;
  cmGeneratedFileStream *pcVar1;
  cmLocalUnixMakefileGenerator3 *pcVar2;
  bool bVar3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  string *psVar6;
  _Alloc_hider _Var7;
  undefined8 in_R8;
  string *d;
  string_view str;
  string_view str_00;
  string_view source;
  string_view source_00;
  string_view source_01;
  string_view source_02;
  string_view source_03;
  string_view source_04;
  string local_308;
  string depTarget;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string dir;
  ostringstream depCmd;
  pointer local_1a0;
  undefined8 local_190;
  pointer local_188;
  
  (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
    super_cmOutputConverter._vptr_cmOutputConverter[0x10])
            (&dir,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  cmStrCat<std::__cxx11::string&,char_const(&)[18]>
            ((string *)&depCmd,&dir,(char (*) [18])"/DependInfo.cmake");
  localPath = &this->InfoFileNameFull;
  std::__cxx11::string::operator=((string *)localPath,(string *)&depCmd);
  std::__cxx11::string::~string((string *)&depCmd);
  cmLocalUnixMakefileGenerator3::ConvertToFullPath((string *)&depCmd,this->LocalGenerator,localPath)
  ;
  std::__cxx11::string::operator=((string *)localPath,(string *)&depCmd);
  std::__cxx11::string::~string((string *)&depCmd);
  std::make_unique<cmGeneratedFileStream,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&depCmd);
  _Var7._M_p = _depCmd;
  _depCmd = (pointer)0x0;
  pcVar1 = (this->InfoFileStream)._M_t.
           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
  (this->InfoFileStream)._M_t.
  super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>._M_t.
  super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
  super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl =
       (cmGeneratedFileStream *)_Var7._M_p;
  if (pcVar1 != (cmGeneratedFileStream *)0x0) {
    (**(code **)(*(long *)&(pcVar1->super_ofstream).
                           super_basic_ostream<char,_std::char_traits<char>_> + 8))(pcVar1);
    if ((string *)_depCmd != (string *)0x0) {
      (**(code **)(*(long *)_depCmd + 8))();
    }
    _Var7._M_p = (pointer)(this->InfoFileStream)._M_t.
                          super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                          .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
  }
  if ((cmGeneratedFileStream *)_Var7._M_p != (cmGeneratedFileStream *)0x0) {
    cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)_Var7._M_p,true);
    cmLocalUnixMakefileGenerator3::WriteDependLanguageInfo
              (this->LocalGenerator,
               (ostream *)
               (this->InfoFileStream)._M_t.
               super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
               .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
               (this->super_cmCommonTargetGenerator).GeneratorTarget);
    if ((this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      poVar4 = std::operator<<((ostream *)
                               (this->InfoFileStream)._M_t.
                               super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                               .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                               "\n");
      poVar4 = std::operator<<(poVar4,"# Pairs of files generated by the same build rule.\n");
      std::operator<<(poVar4,"set(CMAKE_MULTIPLE_OUTPUT_PAIRS\n");
      for (p_Var5 = (this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
          ; pcVar1 = (this->InfoFileStream)._M_t.
                     super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                     .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
          (_Rb_tree_header *)p_Var5 !=
          &(this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header;
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
        poVar4 = std::operator<<((ostream *)pcVar1,"  ");
        str._M_str = (char *)0x0;
        str._M_len = *(ulong *)(p_Var5 + 1);
        cmOutputConverter::EscapeForCMake_abi_cxx11_
                  ((string *)&depCmd,(cmOutputConverter *)p_Var5[1]._M_parent,str,(WrapQuotes)in_R8)
        ;
        poVar4 = std::operator<<(poVar4,(string *)&depCmd);
        poVar4 = std::operator<<(poVar4," ");
        str_00._M_str = (char *)0x0;
        str_00._M_len = *(ulong *)(p_Var5 + 2);
        cmOutputConverter::EscapeForCMake_abi_cxx11_
                  (&depTarget,(cmOutputConverter *)p_Var5[2]._M_parent,str_00,(WrapQuotes)in_R8);
        poVar4 = std::operator<<(poVar4,(string *)&depTarget);
        std::operator<<(poVar4,"\n");
        std::__cxx11::string::~string((string *)&depTarget);
        std::__cxx11::string::~string((string *)&depCmd);
      }
      std::operator<<((ostream *)pcVar1,"  )\n\n");
    }
    std::operator<<((ostream *)
                    (this->InfoFileStream)._M_t.
                    super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                    .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                    "\n# Targets to which this target links which contain Fortran sources.\nset(CMAKE_Fortran_TARGET_LINKED_INFO_FILES\n"
                   );
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&depTarget,"Fortran",(allocator<char> *)&local_268);
    GetConfigName_abi_cxx11_(&local_308,this);
    cmCommonTargetGenerator::GetLinkedTargetDirectories
              ((LinkedTargetDirs *)&depCmd,&this->super_cmCommonTargetGenerator,&depTarget,
               &local_308);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&depTarget);
    for (_Var7._M_p = _depCmd;
        pcVar1 = (this->InfoFileStream)._M_t.
                 super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                 .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
        (pointer)_Var7._M_p != local_1a0; _Var7._M_p = _Var7._M_p + 0x20) {
      poVar4 = std::operator<<((ostream *)pcVar1,"  \"");
      poVar4 = std::operator<<(poVar4,(string *)_Var7._M_p);
      std::operator<<(poVar4,"/DependInfo.cmake\"\n");
    }
    std::operator<<((ostream *)pcVar1,"  )\n");
    std::operator<<((ostream *)
                    (this->InfoFileStream)._M_t.
                    super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                    .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                    "\n# Targets to which this target links which contain Fortran sources.\nset(CMAKE_Fortran_TARGET_FORWARD_LINKED_INFO_FILES\n"
                   );
    for (; pcVar1 = (this->InfoFileStream)._M_t.
                    super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                    .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
        (pointer)local_190 != local_188; local_190 = local_190 + 0x20) {
      poVar4 = std::operator<<((ostream *)pcVar1,"  \"");
      poVar4 = std::operator<<(poVar4,(string *)local_190);
      std::operator<<(poVar4,"/DependInfo.cmake\"\n");
    }
    std::operator<<((ostream *)pcVar1,"  )\n");
    cmCommonTargetGenerator::LinkedTargetDirs::~LinkedTargetDirs((LinkedTargetDirs *)&depCmd);
    psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                       ((cmLocalGenerator *)this->LocalGenerator);
    poVar4 = std::operator<<((ostream *)
                             (this->InfoFileStream)._M_t.
                             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                             "\n");
    poVar4 = std::operator<<(poVar4,"# Fortran module output directory.\n");
    poVar4 = std::operator<<(poVar4,"set(CMAKE_Fortran_TARGET_MODULE_DIR \"");
    cmGeneratorTarget::GetFortranModuleDirectory
              ((string *)&depCmd,(this->super_cmCommonTargetGenerator).GeneratorTarget,psVar6);
    poVar4 = std::operator<<(poVar4,(string *)&depCmd);
    std::operator<<(poVar4,"\")\n");
    std::__cxx11::string::~string((string *)&depCmd);
    bVar3 = cmGeneratorTarget::IsFortranBuildingInstrinsicModules
                      ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    if (bVar3) {
      poVar4 = std::operator<<((ostream *)
                               (this->InfoFileStream)._M_t.
                               super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                               .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                               "\n");
      poVar4 = std::operator<<(poVar4,"# Fortran compiler is building intrinsic modules.\n");
      std::operator<<(poVar4,"set(CMAKE_Fortran_TARGET_BUILDING_INSTRINSIC_MODULES ON) \n");
    }
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
              ((string *)&depCmd,this->LocalGenerator,
               (this->super_cmCommonTargetGenerator).GeneratorTarget);
    cmStrCat<std::__cxx11::string,char_const(&)[8]>
              (&depTarget,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&depCmd,
               (char (*) [8])"/depend");
    std::__cxx11::string::~string((string *)&depCmd);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&depCmd);
    poVar4 = std::operator<<((ostream *)&depCmd,"cd ");
    pcVar2 = this->LocalGenerator;
    psVar6 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar2);
    source._M_str = (psVar6->_M_dataplus)._M_p;
    source._M_len = psVar6->_M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_308,(cmOutputConverter *)pcVar2,source,SHELL,false);
    poVar4 = std::operator<<(poVar4,(string *)&local_308);
    std::operator<<(poVar4," && ");
    std::__cxx11::string::~string((string *)&local_308);
    poVar4 = std::operator<<((ostream *)&depCmd,"$(CMAKE_COMMAND) -E cmake_depends \"");
    (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
      _vptr_cmGlobalGenerator[3])(&local_308);
    poVar4 = std::operator<<(poVar4,(string *)&local_308);
    poVar4 = std::operator<<(poVar4,"\" ");
    pcVar2 = this->LocalGenerator;
    psVar6 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_((cmLocalGenerator *)pcVar2);
    source_00._M_str = (psVar6->_M_dataplus)._M_p;
    source_00._M_len = psVar6->_M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_268,(cmOutputConverter *)pcVar2,source_00,SHELL,false);
    poVar4 = std::operator<<(poVar4,(string *)&local_268);
    poVar4 = std::operator<<(poVar4," ");
    pcVar2 = this->LocalGenerator;
    psVar6 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_((cmLocalGenerator *)pcVar2);
    source_01._M_str = (psVar6->_M_dataplus)._M_p;
    source_01._M_len = psVar6->_M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_1e8,(cmOutputConverter *)pcVar2,source_01,SHELL,false);
    poVar4 = std::operator<<(poVar4,(string *)&local_1e8);
    poVar4 = std::operator<<(poVar4," ");
    pcVar2 = this->LocalGenerator;
    psVar6 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar2);
    source_02._M_str = (psVar6->_M_dataplus)._M_p;
    source_02._M_len = psVar6->_M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_208,(cmOutputConverter *)pcVar2,source_02,SHELL,false);
    poVar4 = std::operator<<(poVar4,(string *)&local_208);
    poVar4 = std::operator<<(poVar4," ");
    pcVar2 = this->LocalGenerator;
    psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar2);
    source_03._M_str = (psVar6->_M_dataplus)._M_p;
    source_03._M_len = psVar6->_M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_228,(cmOutputConverter *)pcVar2,source_03,SHELL,false);
    poVar4 = std::operator<<(poVar4,(string *)&local_228);
    poVar4 = std::operator<<(poVar4," ");
    pcVar2 = this->LocalGenerator;
    cmsys::SystemTools::CollapseFullPath(&local_288,localPath);
    source_04._M_str = local_288._M_dataplus._M_p;
    source_04._M_len = local_288._M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_248,(cmOutputConverter *)pcVar2,source_04,SHELL,false);
    std::operator<<(poVar4,(string *)&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_308);
    if (this->LocalGenerator->ColorMakefile == true) {
      std::operator<<((ostream *)&depCmd," \"--color=$(COLOR)\"");
    }
    std::__cxx11::stringbuf::str();
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
               &local_308);
    std::__cxx11::string::~string((string *)&local_308);
    if (this->CustomCommandDriver == OnDepends) {
      ::cm::
      append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                (&depends,&this->CustomCommandOutputs);
    }
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              (this->LocalGenerator,
               (ostream *)
               (this->BuildFileStream)._M_t.
               super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
               .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,(char *)0x0,
               &depTarget,&depends,&commands,true,false);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&depCmd);
    std::__cxx11::string::~string((string *)&depTarget);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&commands);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&depends);
  }
  std::__cxx11::string::~string((string *)&dir);
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteTargetDependRules()
{
  // must write the targets depend info file
  std::string dir =
    this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget);
  this->InfoFileNameFull = cmStrCat(dir, "/DependInfo.cmake");
  this->InfoFileNameFull =
    this->LocalGenerator->ConvertToFullPath(this->InfoFileNameFull);
  this->InfoFileStream =
    cm::make_unique<cmGeneratedFileStream>(this->InfoFileNameFull);
  if (!this->InfoFileStream) {
    return;
  }
  this->InfoFileStream->SetCopyIfDifferent(true);
  this->LocalGenerator->WriteDependLanguageInfo(*this->InfoFileStream,
                                                this->GeneratorTarget);

  // Store multiple output pairs in the depend info file.
  if (!this->MultipleOutputPairs.empty()) {
    /* clang-format off */
    *this->InfoFileStream
      << "\n"
      << "# Pairs of files generated by the same build rule.\n"
      << "set(CMAKE_MULTIPLE_OUTPUT_PAIRS\n";
    /* clang-format on */
    for (auto const& pi : this->MultipleOutputPairs) {
      *this->InfoFileStream
        << "  " << cmOutputConverter::EscapeForCMake(pi.first) << " "
        << cmOutputConverter::EscapeForCMake(pi.second) << "\n";
    }
    *this->InfoFileStream << "  )\n\n";
  }

  // Store list of targets linked directly or transitively.
  {
    /* clang-format off */
  *this->InfoFileStream
    << "\n"
       "# Targets to which this target links which contain Fortran sources.\n"
       "set(CMAKE_Fortran_TARGET_LINKED_INFO_FILES\n";
    /* clang-format on */
    auto const dirs =
      this->GetLinkedTargetDirectories("Fortran", this->GetConfigName());
    for (std::string const& d : dirs.Direct) {
      *this->InfoFileStream << "  \"" << d << "/DependInfo.cmake\"\n";
    }
    *this->InfoFileStream << "  )\n";

    /* clang-format off */
  *this->InfoFileStream
    << "\n"
       "# Targets to which this target links which contain Fortran sources.\n"
       "set(CMAKE_Fortran_TARGET_FORWARD_LINKED_INFO_FILES\n";
    /* clang-format on */
    for (std::string const& d : dirs.Forward) {
      *this->InfoFileStream << "  \"" << d << "/DependInfo.cmake\"\n";
    }
    *this->InfoFileStream << "  )\n";
  }

  std::string const& working_dir =
    this->LocalGenerator->GetCurrentBinaryDirectory();

  /* clang-format off */
  *this->InfoFileStream
    << "\n"
    << "# Fortran module output directory.\n"
    << "set(CMAKE_Fortran_TARGET_MODULE_DIR \""
    << this->GeneratorTarget->GetFortranModuleDirectory(working_dir)
    << "\")\n";

  if (this->GeneratorTarget->IsFortranBuildingInstrinsicModules()) {
    *this->InfoFileStream
      << "\n"
      << "# Fortran compiler is building intrinsic modules.\n"
      << "set(CMAKE_Fortran_TARGET_BUILDING_INSTRINSIC_MODULES ON) \n";
  }
  /* clang-format on */

  // and now write the rule to use it
  std::vector<std::string> depends;
  std::vector<std::string> commands;

  // Construct the name of the dependency generation target.
  std::string const depTarget = cmStrCat(
    this->LocalGenerator->GetRelativeTargetDirectory(this->GeneratorTarget),
    "/depend");

  // Add a command to call CMake to scan dependencies.  CMake will
  // touch the corresponding depends file after scanning dependencies.
  std::ostringstream depCmd;
// TODO: Account for source file properties and directory-level
// definitions when scanning for dependencies.
#if !defined(_WIN32) || defined(__CYGWIN__)
  // This platform supports symlinks, so cmSystemTools will translate
  // paths.  Make sure PWD is set to the original name of the home
  // output directory to help cmSystemTools to create the same
  // translation table for the dependency scanning process.
  depCmd << "cd "
         << (this->LocalGenerator->ConvertToOutputFormat(
              this->LocalGenerator->GetBinaryDirectory(),
              cmOutputConverter::SHELL))
         << " && ";
#endif
  // Generate a call this signature:
  //
  //   cmake -E cmake_depends <generator>
  //                          <home-src-dir> <start-src-dir>
  //                          <home-out-dir> <start-out-dir>
  //                          <dep-info> --color=$(COLOR)
  //
  // This gives the dependency scanner enough information to recreate
  // the state of our local generator sufficiently for its needs.
  depCmd << "$(CMAKE_COMMAND) -E cmake_depends \""
         << this->GlobalGenerator->GetName() << "\" "
         << this->LocalGenerator->ConvertToOutputFormat(
              this->LocalGenerator->GetSourceDirectory(),
              cmOutputConverter::SHELL)
         << " "
         << this->LocalGenerator->ConvertToOutputFormat(
              this->LocalGenerator->GetCurrentSourceDirectory(),
              cmOutputConverter::SHELL)
         << " "
         << this->LocalGenerator->ConvertToOutputFormat(
              this->LocalGenerator->GetBinaryDirectory(),
              cmOutputConverter::SHELL)
         << " "
         << this->LocalGenerator->ConvertToOutputFormat(
              this->LocalGenerator->GetCurrentBinaryDirectory(),
              cmOutputConverter::SHELL)
         << " "
         << this->LocalGenerator->ConvertToOutputFormat(
              cmSystemTools::CollapseFullPath(this->InfoFileNameFull),
              cmOutputConverter::SHELL);
  if (this->LocalGenerator->GetColorMakefile()) {
    depCmd << " \"--color=$(COLOR)\"";
  }
  commands.push_back(depCmd.str());

  // Make sure all custom command outputs in this target are built.
  if (this->CustomCommandDriver == OnDepends) {
    this->DriveCustomCommands(depends);
  }

  // Write the rule.
  this->LocalGenerator->WriteMakeRule(*this->BuildFileStream, nullptr,
                                      depTarget, depends, commands, true);
}